

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nonlinear_Buffer.cpp
# Opt level: O2

void __thiscall Nonlinear_Buffer::enable_nonlinearity(Nonlinear_Buffer *this,Nes_Apu *apu,bool b)

{
  undefined7 in_register_00000011;
  Blip_Buffer *buf;
  int i;
  uint osc;
  
  if ((int)CONCAT71(in_register_00000011,b) != 0) {
    (*(this->super_Multi_Buffer)._vptr_Multi_Buffer[7])(this);
  }
  Nes_Nonlinearizer::enable(&this->nonlinearizer,apu,b);
  for (osc = 0; osc != 5; osc = osc + 1) {
    buf = &this->buf;
    if (1 < osc) {
      buf = &this->tnd;
    }
    Nes_Apu::osc_output(apu,osc,buf);
  }
  return;
}

Assistant:

void Nonlinear_Buffer::enable_nonlinearity( Nes_Apu& apu, bool b )
{
	if ( b )
		clear();
	nonlinearizer.enable( apu, b );
	for ( int i = 0; i < apu.osc_count; i++ )
		apu.osc_output( i, (i >= 2 ? &tnd : &buf) );
}